

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::resetCursorBlinkTimer(QWidgetLineControl *this)

{
  long lVar1;
  bool bVar2;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000L>_> flashTime;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffa8;
  duration<long,_std::ratio<1L,_1000L>_> *__d;
  Duration duration;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((ushort)in_RDI[10].__r >> 10 & 1) != 0) &&
     (duration.__r = (rep)in_RDI,
     bVar2 = QBasicTimer::isActive((QBasicTimer *)((long)&in_RDI[10].__r + 4)), bVar2)) {
    QBasicTimer::stop();
    QGuiApplication::styleHints();
    QStyleHints::cursorFlashTime();
    ms<(char)49>();
    std::chrono::operator*
              ((int *)in_stack_ffffffffffffffa8,(duration<long,_std::ratio<1L,_1000L>_> *)0x5e1064);
    ms<(char)50>();
    bVar2 = std::chrono::operator>=(in_RDI,in_stack_ffffffffffffffa8);
    if (bVar2) {
      __d = (duration<long,_std::ratio<1L,_1000L>_> *)((long)&in_RDI[10].__r + 4);
      std::chrono::operator/(in_RDI,(int *)__d);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,__d);
      QBasicTimer::start((QBasicTimer *)__d,duration,(QObject *)0x5e10d3);
    }
    *(ushort *)&in_RDI[10].__r = (ushort)in_RDI[10].__r & 0xfdff | 0x200;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::resetCursorBlinkTimer()
{
    if (!m_blinkEnabled || !m_blinkTimer.isActive())
        return;
    m_blinkTimer.stop();
    const auto flashTime = QGuiApplication::styleHints()->cursorFlashTime() * 1ms;
    if (flashTime >= 2ms)
        m_blinkTimer.start(flashTime / 2, this);
    m_blinkStatus = 1;
}